

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_encoder.hpp
# Opt level: O0

bool __thiscall
jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::
visit_end_array(basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *this,
               ser_context *param_2,error_code *ec)

{
  bool bVar1;
  undefined8 uVar2;
  reference pvVar3;
  size_t sVar4;
  size_t sVar5;
  basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *pbVar6;
  long in_RDI;
  string *in_stack_ffffffffffffff78;
  basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *in_stack_ffffffffffffff80
  ;
  undefined8 in_stack_ffffffffffffff88;
  uint8_t ch;
  cbor_errc __e;
  binary_stream_sink *in_stack_ffffffffffffff90;
  allocator<char> *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  
  ch = (uint8_t)((ulong)in_stack_ffffffffffffff88 >> 0x38);
  bVar1 = std::
          vector<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
          ::empty((vector<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
                   *)in_stack_ffffffffffffff90);
  if (bVar1) {
    uVar2 = __cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    assertion_error::assertion_error
              ((assertion_error *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    __cxa_throw(uVar2,&assertion_error::typeinfo,assertion_error::~assertion_error);
  }
  *(int *)(in_RDI + 0xe8) = *(int *)(in_RDI + 0xe8) + -1;
  pvVar3 = std::
           vector<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
           ::back((vector<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
                   *)in_stack_ffffffffffffff80);
  bVar1 = stack_item::is_indefinite_length(pvVar3);
  if (bVar1) {
    binary_stream_sink::push_back(in_stack_ffffffffffffff90,ch);
  }
  else {
    std::
    vector<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
    ::back((vector<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
            *)in_stack_ffffffffffffff80);
    sVar4 = stack_item::count((stack_item *)in_stack_ffffffffffffff80);
    pvVar3 = std::
             vector<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
             ::back((vector<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
                     *)in_stack_ffffffffffffff80);
    sVar5 = stack_item::length(pvVar3);
    if (sVar4 < sVar5) {
      std::error_code::operator=((error_code *)in_stack_ffffffffffffff90,(cbor_errc)(sVar4 >> 0x20))
      ;
      return true;
    }
    std::
    vector<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
    ::back((vector<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
            *)in_stack_ffffffffffffff80);
    __e = (cbor_errc)(sVar4 >> 0x20);
    in_stack_ffffffffffffff80 =
         (basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *)
         stack_item::count((stack_item *)in_stack_ffffffffffffff80);
    pvVar3 = std::
             vector<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
             ::back((vector<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
                     *)in_stack_ffffffffffffff80);
    pbVar6 = (basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *)
             stack_item::length(pvVar3);
    if (pbVar6 < in_stack_ffffffffffffff80) {
      std::error_code::operator=((error_code *)in_stack_ffffffffffffff90,__e);
      return true;
    }
  }
  std::
  vector<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
  ::pop_back((vector<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
              *)0x30c6c9);
  end_value(in_stack_ffffffffffffff80);
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_end_array(const ser_context&, std::error_code& ec) override
    {
        JSONCONS_ASSERT(!stack_.empty());
        --nesting_depth_;

        if (stack_.back().is_indefinite_length())
        {
            sink_.push_back(0xff);
        }
        else
        {
            if (stack_.back().count() < stack_.back().length())
            {
                ec = cbor_errc::too_few_items;
                JSONCONS_VISITOR_RETURN;
            }
            if (stack_.back().count() > stack_.back().length())
            {
                ec = cbor_errc::too_many_items;
                JSONCONS_VISITOR_RETURN;
            }
        }

        stack_.pop_back();
        end_value();

        JSONCONS_VISITOR_RETURN;
    }